

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

index_t __thiscall
GEO::Delaunay2d::new_triangle
          (Delaunay2d *this,signed_index_t v1,signed_index_t v2,signed_index_t v3)

{
  pointer piVar1;
  index_t iVar2;
  
  iVar2 = new_triangle(this);
  piVar1 = (this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1[iVar2 * 3] = v1;
  piVar1[iVar2 * 3 + 1] = v2;
  piVar1[iVar2 * 3 + 2] = v3;
  return iVar2;
}

Assistant:

index_t new_triangle(
            signed_index_t v1, signed_index_t v2, 
            signed_index_t v3
        ) {
            index_t result = new_triangle();
            cell_to_v_store_[3 * result] = v1;
            cell_to_v_store_[3 * result + 1] = v2;
            cell_to_v_store_[3 * result + 2] = v3;
            return result;
        }